

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image_test.cc
# Opt level: O0

void __thiscall
AomImageTest_AomImgSetRectOverflow_Test::TestBody(AomImageTest_AomImgSetRectOverflow_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint align;
  aom_img_fmt_t format;
  aom_image_t img;
  uchar buf [49152];
  int kHeight;
  int kWidth;
  AssertHelper *in_stack_ffffffffffff3e60;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffff3e68;
  undefined1 in_stack_ffffffffffff3e6f;
  char *in_stack_ffffffffffff3e70;
  uchar *in_stack_ffffffffffff3e78;
  AssertionResult *this_01;
  int line;
  uint in_stack_ffffffffffff3e80;
  uint in_stack_ffffffffffff3e84;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffff3e88;
  Type type;
  aom_image_t *img_00;
  AssertionResult local_c140;
  Message *in_stack_ffffffffffff3ed8;
  undefined4 in_stack_ffffffffffff3ee0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffff3ee4;
  AssertionResult local_c118 [3];
  aom_image_t *local_c0e8;
  aom_image_t *local_c0e0;
  AssertionResult local_c0d8;
  undefined4 local_c0c8;
  undefined4 local_c0c4;
  aom_image_t local_c0c0 [293];
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0x80;
  local_10 = 0x80;
  local_c0c4 = 0x106;
  local_c0c8 = 0x20;
  img_00 = local_c0c0;
  local_c0e0 = aom_img_wrap(img_00,(aom_img_fmt_t)((ulong)in_stack_ffffffffffff3e88 >> 0x20),
                            (uint)in_stack_ffffffffffff3e88,in_stack_ffffffffffff3e84,
                            in_stack_ffffffffffff3e80,in_stack_ffffffffffff3e78);
  type = (Type)((ulong)in_stack_ffffffffffff3e88 >> 0x20);
  local_c0e8 = img_00;
  testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
            ((char *)in_stack_ffffffffffff3e78,in_stack_ffffffffffff3e70,
             (aom_image **)CONCAT17(in_stack_ffffffffffff3e6f,in_stack_ffffffffffff3e68),
             (aom_image **)in_stack_ffffffffffff3e60);
  iVar2 = (int)((ulong)in_stack_ffffffffffff3e78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0d8);
  if (!bVar1) {
    testing::Message::Message((Message *)img_00);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3aaf97);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)img_00,type,
               (char *)CONCAT44(in_stack_ffffffffffff3e84,in_stack_ffffffffffff3e80),iVar2,
               in_stack_ffffffffffff3e70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffff3ee4,in_stack_ffffffffffff3ee0),
               in_stack_ffffffffffff3ed8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffff3e60);
    testing::Message::~Message((Message *)0x3aaff4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab04c);
  iVar2 = aom_img_set_rect(local_c0c0,0,0,0x80,0x80,0);
  uVar5 = 0;
  this_01 = local_c118;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_ffffffffffff3e70,
             (int *)CONCAT17(in_stack_ffffffffffff3e6f,in_stack_ffffffffffff3e68),
             (int *)in_stack_ffffffffffff3e60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffff3e84);
  if (!bVar1) {
    testing::Message::Message((Message *)img_00);
    in_stack_ffffffffffff3e70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3ab113);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)img_00,type,(char *)CONCAT44(uVar4,in_stack_ffffffffffff3e80),
               (int)((ulong)this_01 >> 0x20),in_stack_ffffffffffff3e70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_ffffffffffff3ed8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffff3e60);
    testing::Message::~Message((Message *)0x3ab167);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab1b9);
  aom_img_set_rect(local_c0c0,0xffffffff,0xffffffff,0x80,0x80,0);
  this_00 = &local_c140;
  testing::internal::CmpHelperNE<int,int>
            (&this_01->success_,in_stack_ffffffffffff3e70,
             (int *)CONCAT17(in_stack_ffffffffffff3e6f,in_stack_ffffffffffff3e68),(int *)this_00);
  line = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)img_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x3ab26c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)img_00,type,(char *)CONCAT44(uVar4,in_stack_ffffffffffff3e80),line,
               in_stack_ffffffffffff3e70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_ffffffffffff3ed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x3ab2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab304);
  return;
}

Assistant:

TEST(AomImageTest, AomImgSetRectOverflow) {
  const int kWidth = 128;
  const int kHeight = 128;
  unsigned char buf[kWidth * kHeight * 3];

  aom_image_t img;
  aom_img_fmt_t format = AOM_IMG_FMT_I444;
  unsigned int align = 32;
  EXPECT_EQ(aom_img_wrap(&img, format, kWidth, kHeight, align, buf), &img);

  EXPECT_EQ(aom_img_set_rect(&img, 0, 0, kWidth, kHeight, 0), 0);
  // This would result in overflow because -1 is cast to UINT_MAX.
  EXPECT_NE(aom_img_set_rect(&img, static_cast<unsigned int>(-1),
                             static_cast<unsigned int>(-1), kWidth, kHeight, 0),
            0);
}